

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O2

Info * __thiscall
CMU462::DynamicScene::XFormWidget::getInfo_abi_cxx11_
          (Info *__return_storage_ptr__,XFormWidget *this)

{
  HalfedgeElement *pHVar1;
  SceneObject *pSVar2;
  allocator<char> local_31;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pHVar1 = (this->target).element;
  if (pHVar1 == (HalfedgeElement *)0x0) {
    pSVar2 = (this->target).object;
    if (pSVar2 == (SceneObject *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_30,"TRANSFORMATION",&local_31);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 __return_storage_ptr__,&local_30);
      std::__cxx11::string::~string((string *)&local_30);
      return __return_storage_ptr__;
    }
    (*pSVar2->_vptr_SceneObject[5])(&local_30);
  }
  else {
    (*pHVar1->_vptr_HalfedgeElement[3])(&local_30,pHVar1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_move_assign(__return_storage_ptr__,&local_30);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

Info XFormWidget::getInfo()
{
   Info info;

   if( target.element != nullptr )
   {
      info = target.element->getInfo();
      return info;
   }
   
   if( target.object != nullptr )
   {
      info = target.object->getInfo();
      return info;
   }

   info.push_back( "TRANSFORMATION" );
   return info;
}